

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O3

int __thiscall QOpenGLTextureGlyphCache::maxTextureHeight(QOpenGLTextureGlyphCache *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = QOpenGLContext::currentContext();
  if (lVar4 == 0) {
    iVar3 = -1;
  }
  else {
    cVar1 = *(char *)(*(long *)(lVar4 + 8) + 0xfd);
    iVar2 = QOpenGLContextPrivate::maxTextureSize();
    iVar3 = iVar2;
    if ((cVar1 == '\x01') && (iVar3 = 0x400, iVar2 < 0x400)) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int QOpenGLTextureGlyphCache::maxTextureHeight() const
{
    QOpenGLContext *ctx = const_cast<QOpenGLContext *>(QOpenGLContext::currentContext());
    if (ctx == nullptr)
        return QImageTextureGlyphCache::maxTextureHeight();

    if (ctx->d_func()->workaround_brokenTexSubImage)
        return qMin(1024, ctx->d_func()->maxTextureSize());
    else
        return ctx->d_func()->maxTextureSize();
}